

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::junit_reporter::~junit_reporter(junit_reporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  
  (this->super_reporter)._vptr_reporter = (_func_int **)&PTR__junit_reporter_0020bc20;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->data)._M_h);
  pcVar3 = (this->current)._M_dataplus._M_p;
  paVar1 = &(this->current).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->title)._M_dataplus._M_p;
  paVar1 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_reporter)._vptr_reporter = (_func_int **)&PTR__reporter_0020ba98;
  p_Var4 = (this->super_reporter).os.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pfVar2 = &(this->super_reporter).os;
    (*p_Var4)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  operator_delete(this,0xb8);
  return;
}

Assistant:

std::string description() override {
            return "outputs results to a JUnit-compatible XML file";
        }